

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<3> * pbrt::SquareMatrix<3>::Zero(void)

{
  int i;
  long lVar1;
  Float (*paFVar2) [3];
  int j;
  long lVar3;
  Float (*in_RDI) [3];
  
  SquareMatrix((SquareMatrix<3> *)in_RDI);
  paFVar2 = in_RDI;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(Float (*) [3])*paFVar2)[lVar3] = 0.0;
    }
    paFVar2 = paFVar2 + 1;
  }
  return (SquareMatrix<3> *)in_RDI;
}

Assistant:

Zero() {
        SquareMatrix m;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m.m[i][j] = 0;
        return m;
    }